

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_binning_array_aligned.h
# Opt level: O1

Split * __thiscall
embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,_32UL>::find
          (Split *__return_storage_ptr__,HeuristicArrayBinningMB<embree::PrimRefMB,_32UL> *this,
          SetMB *set,size_t logBlockSize)

{
  BBox3fa *pBVar1;
  int *piVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  unsigned_long uVar10;
  unsigned_long uVar11;
  ulong uVar12;
  ulong uVar13;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar14;
  char cVar15;
  long lVar16;
  ulong uVar17;
  runtime_error *this_00;
  undefined1 (*pauVar18) [16];
  ulong uVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar24;
  ulong uVar25;
  float fVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  uint uVar32;
  uint uVar33;
  undefined1 auVar31 [16];
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar38;
  uint uVar39;
  undefined1 auVar37 [16];
  uint uVar40;
  uint uVar41;
  float fVar42;
  uint uVar43;
  uint uVar44;
  undefined1 auVar45 [16];
  uint uVar47;
  undefined1 auVar46 [16];
  float fVar48;
  float fVar49;
  float fVar52;
  float fVar53;
  float fVar54;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar55 [16];
  float fVar57;
  float fVar58;
  undefined1 auVar56 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar62;
  undefined1 auVar61 [16];
  undefined1 auVar63 [16];
  uint uVar64;
  uint uVar65;
  float fVar66;
  uint uVar67;
  uint uVar68;
  float fVar69;
  vuint4 vbestPos;
  BinMapping<32UL> mapping;
  task_group_context context;
  ObjectBinner binner;
  vfloat4 rAreas [32];
  undefined1 local_37c0 [8];
  float fStack_37b8;
  undefined1 local_37b0 [16];
  undefined1 local_37a0 [8];
  float fStack_3798;
  anon_class_16_2_ed117de8_conflict16 local_3750;
  anon_class_8_1_b5464bae local_3740;
  PrimRefMB *local_3738;
  undefined1 local_3730 [32];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_3710;
  blocked_range<unsigned_long> local_3700;
  ulong local_36e0;
  anon_class_16_2_be24578a_conflict local_3690;
  task_group_context local_3680 [3];
  undefined1 auStack_3490 [16];
  undefined1 local_3480 [6652];
  undefined4 uStack_1a84;
  undefined1 local_1a80 [20];
  float afStack_1a6c [1679];
  
  lVar16 = 0x1800;
  pauVar18 = (undefined1 (*) [16])(local_3480 + 0xb0);
  do {
    pauVar18[-3] = _DAT_01feb9f0;
    pauVar18[-2] = _DAT_01feba00;
    pauVar18[-1] = _DAT_01feb9f0;
    *pauVar18 = _DAT_01feba00;
    pauVar18[-7] = _DAT_01feb9f0;
    pauVar18[-6] = _DAT_01feba00;
    pauVar18[-5] = _DAT_01feb9f0;
    pauVar18[-4] = _DAT_01feba00;
    pauVar18[-0xb] = _DAT_01feb9f0;
    pauVar18[-10] = _DAT_01feba00;
    pauVar18[-9] = _DAT_01feb9f0;
    pauVar18[-8] = _DAT_01feba00;
    *(undefined8 *)(local_3480 + lVar16) = 0;
    *(undefined8 *)(local_3480 + lVar16 + 8) = 0;
    lVar16 = lVar16 + 0x10;
    pauVar18 = pauVar18 + 0xc;
  } while (lVar16 != 0x1a00);
  uVar10 = (set->super_PrimInfoMB).object_range._begin;
  uVar11 = (set->super_PrimInfoMB).object_range._end;
  uVar19 = uVar11 - uVar10;
  fVar26 = (float)uVar19 * 0.05 + 4.0;
  uVar17 = (ulong)fVar26;
  uVar17 = (long)(fVar26 - 9.223372e+18) & (long)uVar17 >> 0x3f | uVar17;
  local_3730._0_8_ = 0x20;
  if (uVar17 < 0x20) {
    local_3730._0_8_ = uVar17;
  }
  pBVar1 = &(set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds;
  local_3730._16_4_ = (pBVar1->lower).field_0.m128[0];
  local_3730._20_4_ =
       (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
       field_0.m128[1];
  local_3730._24_4_ =
       (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
       field_0.m128[2];
  local_3730._28_4_ =
       (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
       field_0.m128[3];
  auVar31 = *(undefined1 (*) [16])(pBVar1->lower).field_0.m128;
  auVar37._0_4_ =
       (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
       field_0.m128[0] - (float)local_3730._16_4_;
  auVar37._4_4_ =
       (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
       field_0.m128[1] - (float)local_3730._20_4_;
  auVar37._8_4_ =
       (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
       field_0.m128[2] - (float)local_3730._24_4_;
  auVar37._12_4_ =
       (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
       field_0.m128[3] - (float)local_3730._28_4_;
  auVar45 = maxps(_DAT_01fecb10,auVar37);
  auVar50._0_4_ = (float)(long)local_3730._0_8_ * 0.99;
  auVar50._4_4_ = auVar50._0_4_;
  auVar50._8_4_ = auVar50._0_4_;
  auVar50._12_4_ = auVar50._0_4_;
  auVar37 = divps(auVar50,auVar45);
  local_3710.i[0] = -(uint)((float)DAT_01fecb10 < auVar45._0_4_) & auVar37._0_4_;
  local_3710.i[1] = -(uint)(DAT_01fecb10._4_4_ < auVar45._4_4_) & auVar37._4_4_;
  local_3710.i[2] = -(uint)(DAT_01fecb10._8_4_ < auVar45._8_4_) & auVar37._8_4_;
  local_3710.i[3] = -(uint)(DAT_01fecb10._12_4_ < auVar45._12_4_) & auVar37._12_4_;
  local_3738 = set->prims->items;
  if (uVar19 < 0xc00) {
    if (uVar11 != uVar10) {
      if (uVar19 == 1) {
        uVar17 = 0;
        local_37a0._0_4_ = local_3730._16_4_;
        local_37a0._4_4_ = local_3730._20_4_;
        fStack_3798 = (float)local_3730._24_4_;
      }
      else {
        uVar21 = (int)local_3730._0_8_ - 1;
        paVar24 = &local_3738[uVar10 + 1].lbounds.bounds1.upper.field_0;
        uVar17 = 0;
        local_37a0._0_4_ = local_3730._16_4_;
        local_37a0._4_4_ = local_3730._20_4_;
        fStack_3798 = (float)local_3730._24_4_;
        do {
          aVar3 = paVar24[-8].field_1;
          aVar4 = paVar24[-7].field_1;
          aVar5 = paVar24[-6].field_1;
          aVar6 = paVar24[-5].field_1;
          uVar36 = (uint)(((aVar4.x * 0.5 + aVar6.x * 0.5 + aVar3.x * 0.5 + aVar5.x * 0.5) -
                          (float)local_37a0._0_4_) * local_3710.v[0] + -0.5);
          uVar38 = (uint)(((aVar4.y * 0.5 + aVar6.y * 0.5 + aVar3.y * 0.5 + aVar5.y * 0.5) -
                          (float)local_37a0._4_4_) * local_3710.v[1] + -0.5);
          uVar39 = (uint)(((aVar4.z * 0.5 + aVar6.z * 0.5 + aVar3.z * 0.5 + aVar5.z * 0.5) -
                          fStack_3798) * local_3710.v[2] + -0.5);
          uVar64 = -(uint)((int)uVar21 < (int)uVar36);
          uVar65 = -(uint)((int)uVar21 < (int)uVar38);
          uVar67 = -(uint)((int)uVar21 < (int)uVar39);
          uVar64 = ~uVar64 & uVar36 | uVar21 & uVar64;
          uVar47 = ~uVar65 & uVar38 | uVar21 & uVar65;
          uVar35 = ~uVar67 & uVar39 | uVar21 & uVar67;
          aVar7 = paVar24[-3].field_1;
          aVar8 = paVar24[-2].field_1;
          aVar9 = paVar24[-1].field_1;
          aVar14.m128 = *(__m128 *)paVar24;
          uVar36 = (uint)(((aVar8.x * 0.5 + paVar24->m128[0] * 0.5 + aVar7.x * 0.5 + aVar9.x * 0.5)
                          - (float)local_37a0._0_4_) * local_3710.v[0] + -0.5);
          uVar38 = (uint)(((aVar8.y * 0.5 + paVar24->m128[1] * 0.5 + aVar7.y * 0.5 + aVar9.y * 0.5)
                          - (float)local_37a0._4_4_) * local_3710.v[1] + -0.5);
          uVar39 = (uint)(((aVar8.z * 0.5 + paVar24->m128[2] * 0.5 + aVar7.z * 0.5 + aVar9.z * 0.5)
                          - fStack_3798) * local_3710.v[2] + -0.5);
          uVar65 = -(uint)((int)uVar21 < (int)uVar36);
          uVar67 = -(uint)((int)uVar21 < (int)uVar38);
          uVar68 = -(uint)((int)uVar21 < (int)uVar39);
          uVar25 = (ulong)(-(uint)(0 < (int)uVar64) & uVar64);
          lVar16 = uVar25 * 0xc0;
          auVar37 = minps(*(undefined1 (*) [16])(local_3480 + lVar16),(undefined1  [16])aVar3);
          *(undefined1 (*) [16])(local_3480 + lVar16) = auVar37;
          auVar50 = maxps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0x10),(undefined1  [16])aVar4
                         );
          auVar37 = minps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0x20),(undefined1  [16])aVar5
                         );
          *(undefined1 (*) [16])(local_3480 + lVar16 + 0x10) = auVar50;
          *(undefined1 (*) [16])(local_3480 + lVar16 + 0x20) = auVar37;
          auVar37 = maxps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0x30),(undefined1  [16])aVar6
                         );
          *(undefined1 (*) [16])(local_3480 + lVar16 + 0x30) = auVar37;
          uVar12 = (ulong)(-(uint)(0 < (int)uVar47) & uVar47);
          lVar16 = uVar12 * 0xc0;
          auVar37 = minps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0x40),(undefined1  [16])aVar3
                         );
          *(undefined1 (*) [16])(local_3480 + lVar16 + 0x40) = auVar37;
          auVar37 = maxps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0x50),(undefined1  [16])aVar4
                         );
          *(undefined1 (*) [16])(local_3480 + lVar16 + 0x50) = auVar37;
          auVar37 = minps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0x60),(undefined1  [16])aVar5
                         );
          *(undefined1 (*) [16])(local_3480 + lVar16 + 0x60) = auVar37;
          auVar37 = maxps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0x70),(undefined1  [16])aVar6
                         );
          *(undefined1 (*) [16])(local_3480 + lVar16 + 0x70) = auVar37;
          uVar13 = (ulong)(-(uint)(0 < (int)uVar35) & uVar35);
          lVar16 = uVar13 * 0xc0;
          uVar36 = ~uVar65 & uVar36 | uVar21 & uVar65;
          uVar38 = ~uVar67 & uVar38 | uVar21 & uVar67;
          uVar39 = ~uVar68 & uVar39 | uVar21 & uVar68;
          auVar37 = minps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0x80),(undefined1  [16])aVar3
                         );
          *(undefined1 (*) [16])(local_3480 + lVar16 + 0x80) = auVar37;
          auVar37 = maxps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0x90),(undefined1  [16])aVar4
                         );
          *(undefined1 (*) [16])(local_3480 + lVar16 + 0x90) = auVar37;
          auVar37 = minps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0xa0),(undefined1  [16])aVar5
                         );
          *(undefined1 (*) [16])(local_3480 + lVar16 + 0xa0) = auVar37;
          auVar37 = maxps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0xb0),(undefined1  [16])aVar6
                         );
          *(undefined1 (*) [16])(local_3480 + lVar16 + 0xb0) = auVar37;
          fVar26 = *(float *)((long)paVar24 + -0x54);
          *(int *)(local_3480 + uVar25 * 0x10 + 0x1800) =
               *(int *)(local_3480 + uVar25 * 0x10 + 0x1800) + (int)fVar26;
          *(int *)(local_3480 + uVar12 * 0x10 + 0x1804) =
               *(int *)(local_3480 + uVar12 * 0x10 + 0x1804) + (int)fVar26;
          *(int *)(local_3480 + uVar13 * 0x10 + 0x1808) =
               *(int *)(local_3480 + uVar13 * 0x10 + 0x1808) + (int)fVar26;
          uVar25 = (ulong)(-(uint)(0 < (int)uVar36) & uVar36);
          lVar16 = uVar25 * 0xc0;
          auVar37 = minps(*(undefined1 (*) [16])(local_3480 + lVar16),(undefined1  [16])aVar7);
          *(undefined1 (*) [16])(local_3480 + lVar16) = auVar37;
          auVar37 = maxps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0x10),(undefined1  [16])aVar8
                         );
          auVar50 = minps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0x20),(undefined1  [16])aVar9
                         );
          *(undefined1 (*) [16])(local_3480 + lVar16 + 0x10) = auVar37;
          *(undefined1 (*) [16])(local_3480 + lVar16 + 0x20) = auVar50;
          auVar37 = maxps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0x30),
                          (undefined1  [16])aVar14);
          *(undefined1 (*) [16])(local_3480 + lVar16 + 0x30) = auVar37;
          uVar12 = (ulong)(-(uint)(0 < (int)uVar38) & uVar38);
          lVar16 = uVar12 * 0xc0;
          auVar37 = minps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0x40),(undefined1  [16])aVar7
                         );
          *(undefined1 (*) [16])(local_3480 + lVar16 + 0x40) = auVar37;
          auVar37 = maxps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0x50),(undefined1  [16])aVar8
                         );
          *(undefined1 (*) [16])(local_3480 + lVar16 + 0x50) = auVar37;
          auVar37 = minps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0x60),(undefined1  [16])aVar9
                         );
          *(undefined1 (*) [16])(local_3480 + lVar16 + 0x60) = auVar37;
          auVar37 = maxps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0x70),
                          (undefined1  [16])aVar14);
          *(undefined1 (*) [16])(local_3480 + lVar16 + 0x70) = auVar37;
          uVar13 = (ulong)(-(uint)(0 < (int)uVar39) & uVar39);
          lVar16 = uVar13 * 0xc0;
          auVar37 = minps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0x80),(undefined1  [16])aVar7
                         );
          *(undefined1 (*) [16])(local_3480 + lVar16 + 0x80) = auVar37;
          local_37a0._0_4_ = auVar31._0_4_;
          local_37a0._4_4_ = auVar31._4_4_;
          fStack_3798 = auVar31._8_4_;
          auVar37 = maxps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0x90),(undefined1  [16])aVar8
                         );
          auVar50 = minps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0xa0),(undefined1  [16])aVar9
                         );
          *(undefined1 (*) [16])(local_3480 + lVar16 + 0x90) = auVar37;
          *(undefined1 (*) [16])(local_3480 + lVar16 + 0xa0) = auVar50;
          auVar37 = maxps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0xb0),
                          (undefined1  [16])aVar14);
          *(undefined1 (*) [16])(local_3480 + lVar16 + 0xb0) = auVar37;
          fVar26 = *(float *)((long)paVar24 + -4);
          *(int *)(local_3480 + uVar25 * 0x10 + 0x1800) =
               *(int *)(local_3480 + uVar25 * 0x10 + 0x1800) + (int)fVar26;
          *(int *)(local_3480 + uVar12 * 0x10 + 0x1804) =
               *(int *)(local_3480 + uVar12 * 0x10 + 0x1804) + (int)fVar26;
          *(int *)(local_3480 + uVar13 * 0x10 + 0x1808) =
               *(int *)(local_3480 + uVar13 * 0x10 + 0x1808) + (int)fVar26;
          uVar17 = uVar17 + 2;
          paVar24 = paVar24 + 10;
        } while (uVar17 < uVar19 - 1);
      }
      if (uVar17 < uVar19) {
        aVar3 = local_3738[uVar10 + uVar17].lbounds.bounds0.lower.field_0.field_1;
        aVar4 = local_3738[uVar10 + uVar17].lbounds.bounds0.upper.field_0.field_1;
        aVar5 = local_3738[uVar10 + uVar17].lbounds.bounds1.lower.field_0.field_1;
        aVar6 = local_3738[uVar10 + uVar17].lbounds.bounds1.upper.field_0.field_1;
        uVar36 = (uint)(local_3710.v[0] *
                        ((aVar4.x * 0.5 + aVar6.x * 0.5 + aVar3.x * 0.5 + aVar5.x * 0.5) -
                        (float)local_37a0._0_4_) + -0.5);
        uVar38 = (uint)(local_3710.v[1] *
                        ((aVar4.y * 0.5 + aVar6.y * 0.5 + aVar3.y * 0.5 + aVar5.y * 0.5) -
                        (float)local_37a0._4_4_) + -0.5);
        uVar39 = (uint)(local_3710.v[2] *
                        ((aVar4.z * 0.5 + aVar6.z * 0.5 + aVar3.z * 0.5 + aVar5.z * 0.5) -
                        fStack_3798) + -0.5);
        uVar21 = (int)local_3730._0_8_ - 1;
        uVar64 = -(uint)((int)uVar21 < (int)uVar36);
        uVar65 = -(uint)((int)uVar21 < (int)uVar38);
        uVar47 = -(uint)((int)uVar21 < (int)uVar39);
        uVar36 = ~uVar64 & uVar36 | uVar21 & uVar64;
        uVar38 = ~uVar65 & uVar38 | uVar21 & uVar65;
        uVar21 = ~uVar47 & uVar39 | uVar21 & uVar47;
        iVar27 = *(int *)((long)&local_3738[uVar10 + uVar17].lbounds.bounds1.lower.field_0 + 0xc);
        uVar17 = (ulong)(-(uint)(0 < (int)uVar36) & uVar36);
        *(int *)(local_3480 + uVar17 * 0x10 + 0x1800) =
             *(int *)(local_3480 + uVar17 * 0x10 + 0x1800) + iVar27;
        lVar16 = uVar17 * 0xc0;
        auVar31 = minps(*(undefined1 (*) [16])(local_3480 + lVar16),(undefined1  [16])aVar3);
        *(undefined1 (*) [16])(local_3480 + lVar16) = auVar31;
        auVar31 = maxps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0x10),(undefined1  [16])aVar4);
        *(undefined1 (*) [16])(local_3480 + lVar16 + 0x10) = auVar31;
        auVar31 = minps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0x20),(undefined1  [16])aVar5);
        *(undefined1 (*) [16])(local_3480 + lVar16 + 0x20) = auVar31;
        auVar31 = maxps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0x30),(undefined1  [16])aVar6);
        *(undefined1 (*) [16])(local_3480 + lVar16 + 0x30) = auVar31;
        uVar17 = (ulong)(-(uint)(0 < (int)uVar38) & uVar38);
        *(int *)(local_3480 + uVar17 * 0x10 + 0x1804) =
             *(int *)(local_3480 + uVar17 * 0x10 + 0x1804) + iVar27;
        lVar16 = uVar17 * 0xc0;
        auVar31 = minps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0x40),(undefined1  [16])aVar3);
        *(undefined1 (*) [16])(local_3480 + lVar16 + 0x40) = auVar31;
        auVar31 = maxps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0x50),(undefined1  [16])aVar4);
        *(undefined1 (*) [16])(local_3480 + lVar16 + 0x50) = auVar31;
        auVar31 = minps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0x60),(undefined1  [16])aVar5);
        *(undefined1 (*) [16])(local_3480 + lVar16 + 0x60) = auVar31;
        auVar31 = maxps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0x70),(undefined1  [16])aVar6);
        *(undefined1 (*) [16])(local_3480 + lVar16 + 0x70) = auVar31;
        uVar17 = (ulong)(-(uint)(0 < (int)uVar21) & uVar21);
        *(int *)(local_3480 + uVar17 * 0x10 + 0x1808) =
             *(int *)(local_3480 + uVar17 * 0x10 + 0x1808) + iVar27;
        lVar16 = uVar17 * 0xc0;
        auVar31 = minps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0x80),(undefined1  [16])aVar3);
        *(undefined1 (*) [16])(local_3480 + lVar16 + 0x80) = auVar31;
        auVar31 = maxps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0x90),(undefined1  [16])aVar4);
        *(undefined1 (*) [16])(local_3480 + lVar16 + 0x90) = auVar31;
        auVar31 = minps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0xa0),(undefined1  [16])aVar5);
        *(undefined1 (*) [16])(local_3480 + lVar16 + 0xa0) = auVar31;
        auVar31 = maxps(*(undefined1 (*) [16])(local_3480 + lVar16 + 0xb0),(undefined1  [16])aVar6);
        *(undefined1 (*) [16])(local_3480 + lVar16 + 0xb0) = auVar31;
      }
    }
  }
  else {
    local_3690.prims = &local_3738;
    local_3740.mapping = (BinMapping<32UL> *)local_3730;
    local_3680[0].my_version = proxy_support;
    local_3680[0].my_traits = (context_traits)0x4;
    local_3680[0].my_node = (intrusive_list_node)ZEXT416(0);
    local_3680[0].my_name = CUSTOM_CTX;
    local_3690.mapping = local_3740.mapping;
    tbb::detail::r1::initialize(local_3680);
    local_3700.my_begin = uVar10;
    local_3700.my_end = uVar11;
    local_3700.my_grainsize = 0x400;
    local_3750.reduction = &local_3740;
    local_3750.func = &local_3690;
    tbb::detail::d1::
    parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,_embree::sse2::BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders____builders_______common_algorithms_parallel_reduce_h:59:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders____builders_heuristic_binning_h:513:31)>
              ((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)local_1a80,
               &local_3700,
               (BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)local_3480,
               &local_3750,local_3750.reduction,local_3680);
    cVar15 = tbb::detail::r1::is_group_execution_cancelled(local_3680);
    if (cVar15 != '\0') {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"task cancelled");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(local_3680);
    BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_>::operator=
              ((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)local_3480,
               (BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)local_1a80);
  }
  lVar16 = local_3730._0_8_ - 1;
  if (lVar16 != 0) {
    lVar20 = local_3730._0_8_ * 0x10;
    pauVar18 = (undefined1 (*) [16])(auStack_3490 + local_3730._0_8_ * 0xc0);
    iVar27 = 0;
    iVar28 = 0;
    iVar29 = 0;
    iVar30 = 0;
    lVar22 = 0;
    lVar23 = lVar16;
    auVar31 = _DAT_01feba00;
    auVar37 = _DAT_01feba00;
    auVar50 = _DAT_01feb9f0;
    auVar45 = _DAT_01feba00;
    auVar46 = _DAT_01feb9f0;
    auVar51 = _DAT_01feb9f0;
    auVar55 = _DAT_01feba00;
    auVar56 = _DAT_01feb9f0;
    auVar59 = _DAT_01feba00;
    auVar60 = _DAT_01feb9f0;
    auVar61 = _DAT_01feba00;
    auVar63 = _DAT_01feb9f0;
    do {
      auVar50 = minps(auVar50,pauVar18[-0xb]);
      auVar37 = maxps(auVar37,pauVar18[-10]);
      auVar63 = minps(auVar63,pauVar18[-9]);
      auVar61 = maxps(auVar61,pauVar18[-8]);
      fVar26 = auVar37._4_4_ - auVar50._4_4_;
      fVar42 = auVar37._8_4_ - auVar50._8_4_;
      local_37c0._0_4_ = auVar61._0_4_;
      local_37c0._4_4_ = auVar61._4_4_;
      fStack_37b8 = auVar61._8_4_;
      auVar51 = minps(auVar51,pauVar18[-7]);
      auVar31 = maxps(auVar31,pauVar18[-6]);
      auVar46 = minps(auVar46,pauVar18[-5]);
      fVar62 = (float)local_37c0._4_4_ - auVar63._4_4_;
      fStack_37b8 = fStack_37b8 - auVar63._8_4_;
      auVar45 = maxps(auVar45,pauVar18[-4]);
      fVar48 = auVar31._4_4_ - auVar51._4_4_;
      fVar49 = auVar31._8_4_ - auVar51._8_4_;
      fVar66 = auVar45._4_4_ - auVar46._4_4_;
      fVar69 = auVar45._8_4_ - auVar46._8_4_;
      *(ulong *)(local_3480 + lVar22 + lVar20 + 0x19f0) =
           CONCAT44(((auVar45._0_4_ - auVar46._0_4_) * (fVar66 + fVar69) + fVar69 * fVar66 +
                    (auVar31._0_4_ - auVar51._0_4_) * (fVar48 + fVar49) + fVar49 * fVar48) * 0.5,
                    (((float)local_37c0._0_4_ - auVar63._0_4_) * (fVar62 + fStack_37b8) +
                     fStack_37b8 * fVar62 +
                    (auVar37._0_4_ - auVar50._0_4_) * (fVar26 + fVar42) + fVar42 * fVar26) * 0.5);
      auVar60 = minps(auVar60,pauVar18[-3]);
      auVar59 = maxps(auVar59,pauVar18[-2]);
      auVar56 = minps(auVar56,pauVar18[-1]);
      auVar55 = maxps(auVar55,*pauVar18);
      fVar26 = auVar59._4_4_ - auVar60._4_4_;
      fVar48 = auVar59._8_4_ - auVar60._8_4_;
      fVar42 = auVar55._4_4_ - auVar56._4_4_;
      fVar49 = auVar55._8_4_ - auVar56._8_4_;
      *(float *)(local_3480 + lVar22 + lVar20 + 0x19f8) =
           ((fVar42 + fVar49) * (auVar55._0_4_ - auVar56._0_4_) + fVar49 * fVar42 +
           (fVar26 + fVar48) * (auVar59._0_4_ - auVar60._0_4_) + fVar48 * fVar26) * 0.5;
      piVar2 = (int *)(local_3480 + lVar22 + lVar20 + 0x17f0);
      iVar27 = iVar27 + *piVar2;
      iVar28 = iVar28 + piVar2[1];
      iVar29 = iVar29 + piVar2[2];
      iVar30 = iVar30 + piVar2[3];
      piVar2 = (int *)((long)&(&local_3690)[local_3730._0_8_].prims + lVar22);
      *piVar2 = iVar27;
      piVar2[1] = iVar28;
      piVar2[2] = iVar29;
      piVar2[3] = iVar30;
      *(undefined4 *)((long)&uStack_1a84 + lVar22 + lVar20) = 0;
      lVar22 = lVar22 + -0x10;
      pauVar18 = pauVar18 + -0xc;
      lVar23 = lVar23 + -1;
    } while (lVar23 != 0);
  }
  uVar17 = 0xffffffff;
  local_3700.my_end = _DAT_01feb9f0;
  local_3700.my_begin = _UNK_01feb9f8;
  uVar21 = 0;
  uVar36 = 0;
  uVar38 = 0;
  uVar39 = 0;
  local_3750.reduction = (anon_class_8_1_b5464bae *)0x0;
  local_3750.func = (anon_class_16_2_be24578a_conflict *)0x0;
  _local_37a0 = _DAT_01feb9f0;
  if (1 < (ulong)local_3730._0_8_) {
    uVar64 = ~(-1 << ((byte)logBlockSize & 0x1f));
    uVar65 = 1;
    uVar47 = 1;
    uVar67 = 1;
    uVar35 = 1;
    iVar27 = 0;
    iVar28 = 0;
    iVar29 = 0;
    iVar30 = 0;
    pauVar18 = (undefined1 (*) [16])(local_3480 + 0xb0);
    lVar23 = 0;
    local_37b0 = _DAT_01feba00;
    _local_37c0 = _DAT_01feb9f0;
    uVar21 = 0;
    uVar36 = 0;
    uVar38 = 0;
    uVar39 = 0;
    auVar31 = _DAT_01feba00;
    auVar37 = _DAT_01feb9f0;
    auVar50 = _DAT_01feba00;
    auVar45 = _DAT_01feb9f0;
    auVar46 = _DAT_01feb9f0;
    auVar51 = _DAT_01feba00;
    auVar55 = _DAT_01feba00;
    auVar56 = _DAT_01feb9f0;
    auVar59 = _DAT_01feb9f0;
    auVar60 = _DAT_01feba00;
    do {
      auVar56 = minps(auVar56,pauVar18[-0xb]);
      auVar55 = maxps(auVar55,pauVar18[-10]);
      auVar37 = minps(auVar37,pauVar18[-9]);
      auVar50 = maxps(auVar50,pauVar18[-8]);
      auVar46 = minps(auVar46,pauVar18[-7]);
      auVar60 = maxps(auVar60,pauVar18[-6]);
      fVar57 = auVar55._4_4_ - auVar56._4_4_;
      fVar58 = auVar55._8_4_ - auVar56._8_4_;
      auVar59 = minps(auVar59,pauVar18[-5]);
      fVar62 = auVar50._4_4_ - auVar37._4_4_;
      fVar66 = auVar50._8_4_ - auVar37._8_4_;
      local_37b0 = maxps(local_37b0,pauVar18[-4]);
      fVar26 = auVar60._4_4_ - auVar46._4_4_;
      fVar42 = auVar60._8_4_ - auVar46._8_4_;
      _local_37c0 = minps(_local_37c0,pauVar18[-3]);
      fVar69 = local_37b0._4_4_ - auVar59._4_4_;
      fVar53 = local_37b0._8_4_ - auVar59._8_4_;
      auVar51 = maxps(auVar51,pauVar18[-2]);
      auVar45 = minps(auVar45,pauVar18[-1]);
      auVar31 = maxps(auVar31,*pauVar18);
      fVar52 = auVar51._4_4_ - local_37c0._4_4_;
      fVar54 = auVar51._8_4_ - local_37c0._8_4_;
      fVar48 = auVar31._4_4_ - auVar45._4_4_;
      fVar49 = auVar31._8_4_ - auVar45._8_4_;
      iVar27 = iVar27 + *(int *)(local_3480 + lVar23 + 0x1800);
      iVar28 = iVar28 + *(int *)(local_3480 + lVar23 + 0x1804);
      iVar29 = iVar29 + *(int *)(local_3480 + lVar23 + 0x1808);
      iVar30 = iVar30 + *(int *)(local_3480 + lVar23 + 0x180c);
      fVar48 = (auVar31._0_4_ - auVar45._0_4_) * (fVar48 + fVar49) + fVar49 * fVar48;
      fVar49 = (auVar51._0_4_ - local_37c0._0_4_) * (fVar52 + fVar54) + fVar54 * fVar52;
      local_36e0 = logBlockSize & 0xffffffff;
      uVar68 = iVar27 + uVar64 >> local_36e0;
      uVar32 = iVar28 + uVar64 >> local_36e0;
      uVar33 = iVar29 + uVar64 >> local_36e0;
      uVar34 = iVar30 + uVar64 >> local_36e0;
      uVar40 = *(int *)(local_3680[0].padding + lVar23 + -0x38) + uVar64 >> local_36e0;
      uVar41 = *(int *)(local_3680[0].padding + lVar23 + -0x34) + uVar64 >> local_36e0;
      uVar43 = *(int *)(local_3680[0].padding + lVar23 + -0x30) + uVar64 >> local_36e0;
      uVar44 = *(int *)(local_3680[0].padding + lVar23 + -0x2c) + uVar64 >> local_36e0;
      auVar61._0_4_ =
           ((float)(uVar40 & 0x7fffffff) + (float)((int)uVar40 >> 0x1f & 0x4f000000)) *
           *(float *)(local_1a80 + lVar23 + 0x10) +
           ((float)(uVar68 & 0x7fffffff) + (float)((int)uVar68 >> 0x1f & 0x4f000000)) *
           ((auVar50._0_4_ - auVar37._0_4_) * (fVar62 + fVar66) + fVar66 * fVar62 +
           (auVar55._0_4_ - auVar56._0_4_) * (fVar57 + fVar58) + fVar58 * fVar57) * 0.5;
      auVar61._4_4_ =
           ((float)(uVar41 & 0x7fffffff) + (float)((int)uVar41 >> 0x1f & 0x4f000000)) *
           *(float *)((long)afStack_1a6c + lVar23) +
           ((float)(uVar32 & 0x7fffffff) + (float)((int)uVar32 >> 0x1f & 0x4f000000)) *
           ((local_37b0._0_4_ - auVar59._0_4_) * (fVar69 + fVar53) + fVar53 * fVar69 +
           (auVar60._0_4_ - auVar46._0_4_) * (fVar26 + fVar42) + fVar42 * fVar26) * 0.5;
      auVar61._8_4_ =
           ((float)(uVar43 & 0x7fffffff) + (float)((int)uVar43 >> 0x1f & 0x4f000000)) *
           *(float *)((long)afStack_1a6c + lVar23 + 4) +
           ((float)(uVar33 & 0x7fffffff) + (float)((int)uVar33 >> 0x1f & 0x4f000000)) *
           (fVar49 + fVar48) * 0.5;
      auVar61._12_4_ =
           ((float)(uVar44 & 0x7fffffff) + (float)((int)uVar44 >> 0x1f & 0x4f000000)) *
           *(float *)((long)afStack_1a6c + lVar23 + 8) +
           ((float)(uVar34 & 0x7fffffff) + (float)((int)uVar34 >> 0x1f & 0x4f000000)) *
           (fVar48 + fVar49) * 0.5;
      uVar68 = -(uint)(local_37a0._0_4_ <= auVar61._0_4_);
      uVar32 = -(uint)(local_37a0._4_4_ <= auVar61._4_4_);
      uVar33 = -(uint)(local_37a0._8_4_ <= auVar61._8_4_);
      uVar34 = -(uint)(local_37a0._12_4_ <= auVar61._12_4_);
      uVar40 = ~uVar68 & uVar65;
      uVar41 = ~uVar32 & uVar47;
      uVar43 = ~uVar33 & uVar67;
      uVar44 = ~uVar34 & uVar35;
      _local_37a0 = minps(auVar61,_local_37a0);
      uVar65 = uVar65 + 1;
      uVar47 = uVar47 + 1;
      uVar67 = uVar67 + 1;
      uVar35 = uVar35 + 1;
      pauVar18 = pauVar18 + 0xc;
      uVar21 = uVar40 | uVar21 & uVar68;
      uVar36 = uVar41 | uVar36 & uVar32;
      uVar38 = uVar43 | uVar38 & uVar33;
      uVar39 = uVar44 | uVar39 & uVar34;
      lVar23 = lVar23 + 0x10;
      lVar16 = lVar16 + -1;
    } while (lVar16 != 0);
  }
  local_3700.my_end = local_37a0;
  local_3700.my_begin = local_37a0._8_8_;
  local_3750.reduction = (anon_class_8_1_b5464bae *)CONCAT44(uVar36,uVar21);
  local_3750.func = (anon_class_16_2_be24578a_conflict *)CONCAT44(uVar39,uVar38);
  fVar26 = INFINITY;
  uVar19 = 0;
  iVar27 = 0;
  do {
    if ((((local_3710.v[uVar19] != 0.0) || (NAN(local_3710.v[uVar19]))) &&
        (fVar42 = *(float *)((long)&local_3700.my_end + uVar19 * 4), fVar42 < fVar26)) &&
       (iVar28 = *(int *)((long)&local_3750.reduction + uVar19 * 4), iVar28 != 0)) {
      uVar17 = uVar19 & 0xffffffff;
      iVar27 = iVar28;
      fVar26 = fVar42;
    }
    uVar19 = uVar19 + 1;
  } while (uVar19 != 3);
  __return_storage_ptr__->sah = fVar26;
  __return_storage_ptr__->dim = (int)uVar17;
  (__return_storage_ptr__->field_2).pos = iVar27;
  __return_storage_ptr__->data = 0;
  (__return_storage_ptr__->mapping).num = local_3730._0_8_;
  *(ulong *)&(__return_storage_ptr__->mapping).ofs.field_0 =
       CONCAT44(local_3730._20_4_,local_3730._16_4_);
  *(ulong *)((long)&(__return_storage_ptr__->mapping).ofs.field_0 + 8) =
       CONCAT44(local_3730._28_4_,local_3730._24_4_);
  *(ulong *)&(__return_storage_ptr__->mapping).scale.field_0 =
       CONCAT44(local_3710.i[1],local_3710.i[0]);
  *(ulong *)((long)&(__return_storage_ptr__->mapping).scale.field_0 + 8) =
       CONCAT44(local_3710.i[3],local_3710.i[2]);
  __return_storage_ptr__->sah =
       ((set->super_PrimInfoMB).time_range.upper - (set->super_PrimInfoMB).time_range.lower) *
       fVar26;
  if ((int)uVar17 == -1) {
    __return_storage_ptr__->data = 1;
  }
  return __return_storage_ptr__;
}

Assistant:

const Split find(const SetMB& set, const size_t logBlockSize)
        {
          ObjectBinner binner(empty);
          const BinMapping<BINS> mapping(set.size(),set.centBounds);
          bin_parallel(binner,set.prims->data(),set.begin(),set.end(),PARALLEL_FIND_BLOCK_SIZE,PARALLEL_THRESHOLD,mapping);
          Split osplit = binner.best(mapping,logBlockSize);
          osplit.sah *= set.time_range.size();
          if (!osplit.valid()) osplit.data = Split::SPLIT_FALLBACK; // use fallback split
          return osplit;
        }